

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCatalog.cpp
# Opt level: O3

void __thiscall psy::C::NameCatalog::markIndexedNodeAsEncloser(NameCatalog *this,SyntaxNode *node)

{
  iterator *piVar1;
  _Elt_pointer ppSVar2;
  const_iterator cVar3;
  ostream *poVar4;
  SyntaxNode *local_20;
  SyntaxNode *local_18;
  
  local_20 = node;
  if (node != (SyntaxNode *)0x0) {
    local_18 = node;
    cVar3 = std::_Hashtable<$aed754b5$>::find(&(this->enclosureIdx_)._M_h,&local_18);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_psy::C::SyntaxNode_*const,_std::tuple<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_unsigned_long>_>_>_>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/NameCatalog.cpp"
                 ,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    else {
      ppSVar2 = (this->enclosureStack_).c.
                super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppSVar2 ==
          (this->enclosureStack_).c.
          super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<psy::C::SyntaxNode_const*,std::allocator<psy::C::SyntaxNode_const*>>::
        _M_push_back_aux<psy::C::SyntaxNode_const*const&>
                  ((deque<psy::C::SyntaxNode_const*,std::allocator<psy::C::SyntaxNode_const*>> *)
                   this,&local_20);
      }
      else {
        *ppSVar2 = node;
        piVar1 = &(this->enclosureStack_).c.
                  super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/NameCatalog.cpp"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void NameCatalog::markIndexedNodeAsEncloser(const SyntaxNode* node)
{
    PSY_ASSERT_2(node, return);
    PSY_ASSERT_2(isIndexed(node), return);

    enclosureStack_.push(node);
}